

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O0

ErrorCode PDB::HasValidDBIStream(RawFile *file)

{
  uint32_t uVar1;
  undefined1 local_78 [8];
  StreamHeader header;
  DirectMSFStream stream;
  RawFile *file_local;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>((DirectMSFStream *)&header.flags,file,3);
  uVar1 = DirectMSFStream::GetSize((DirectMSFStream *)&header.flags);
  if (uVar1 < 0x40) {
    file_local._4_4_ = InvalidStream;
  }
  else {
    DirectMSFStream::ReadAtOffset<PDB::DBI::StreamHeader>
              ((StreamHeader *)local_78,(DirectMSFStream *)&header.flags,0);
    if (local_78._0_4_ == 0xffffffff) {
      if (local_78._4_4_ == V70) {
        file_local._4_4_ = Success;
      }
      else {
        file_local._4_4_ = UnknownVersion;
      }
    }
    else {
      file_local._4_4_ = InvalidSignature;
    }
  }
  return file_local._4_4_;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::HasValidDBIStream(const RawFile& file) PDB_NO_EXCEPT
{
	DirectMSFStream stream = file.CreateMSFStream<DirectMSFStream>(DBIStreamIndex);
	if (stream.GetSize() < sizeof(DBI::StreamHeader))
	{
		return ErrorCode::InvalidStream;
	}

	const DBI::StreamHeader header = stream.ReadAtOffset<DBI::StreamHeader>(0u);
	if (header.signature != DBI::StreamHeader::Signature)
	{
		return ErrorCode::InvalidSignature;
	}
	else if (header.version != DBI::StreamHeader::Version::V70)
	{
		return ErrorCode::UnknownVersion;
	}

	return ErrorCode::Success;
}